

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAV.h
# Opt level: O1

void __thiscall
QAV<MonahanPOMDPPlanner>::QAV
          (QAV<MonahanPOMDPPlanner> *this,PlanningUnitDecPOMDPDiscrete *pu,
          MonahanPOMDPPlanner *POMDPPlanner)

{
  undefined8 *puVar1;
  PlanningUnitDecPOMDPDiscrete *pPVar2;
  
  *(PlanningUnitDecPOMDPDiscrete **)&(this->super_QFunctionJointBelief).field_0x18 = pu;
  *(undefined8 *)&(this->super_QFunctionJointBelief).field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  (this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface =
       (QFunctionJointBeliefInterface)0x5a4ff0;
  *(undefined8 *)&(this->super_QFunctionJointBelief).field_0x10 = 0x5a50f0;
  *(undefined8 *)&this->field_0x30 = 0x5a51e0;
  *(MonahanPOMDPPlanner **)&(this->super_QFunctionJointBelief).field_0x8 = POMDPPlanner;
  if (pu == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pu = *(PlanningUnitDecPOMDPDiscrete **)&(this->super_QFunctionJointBelief).field_0x20;
  }
  pPVar2 = (POMDPPlanner->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
  if (pPVar2 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar2 = (POMDPPlanner->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
  }
  if ((pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon ==
      (pPVar2->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon) {
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar1 = &PTR__E_0059bd80;
  puVar1[1] = puVar1 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar1 + 1),"QAV ctor: horizons must match","");
  __cxa_throw(puVar1,&E::typeinfo,E::~E);
}

Assistant:

QAV(const PlanningUnitDecPOMDPDiscrete* pu, P* POMDPPlanner) :
        QFunctionForDecPOMDP(pu), //virtual base first
        QFunctionJointBelief(pu)
        {
            _m_p=POMDPPlanner;
            if(GetPU()->GetHorizon()!=POMDPPlanner->GetPU()->GetHorizon())
                throw(E("QAV ctor: horizons must match"));
        }